

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzterm.c
# Opt level: O0

void fuzz_draw_cursor(TermWin *tw,wchar_t x,wchar_t y,wchar_t *text,wchar_t len,unsigned_long attr,
                     wchar_t lattr,truecolour tc)

{
  wchar_t local_34;
  wchar_t i;
  unsigned_long attr_local;
  wchar_t len_local;
  wchar_t *text_local;
  wchar_t y_local;
  wchar_t x_local;
  TermWin *tw_local;
  
  printf("CURS[attr=%08lx,lattr=%02x]@(%d,%d):",attr,(ulong)(uint)lattr,(ulong)(uint)x,
         (ulong)(uint)y);
  for (local_34 = L'\0'; local_34 < len; local_34 = local_34 + L'\x01') {
    printf(" %x",(ulong)(uint)text[local_34]);
  }
  printf("\n");
  return;
}

Assistant:

static void fuzz_draw_cursor(
    TermWin *tw, int x, int y, wchar_t *text, int len,
    unsigned long attr, int lattr, truecolour tc)
{
    int i;

    printf("CURS[attr=%08lx,lattr=%02x]@(%d,%d):", attr, lattr, x, y);
    for (i = 0; i < len; i++) {
        printf(" %x", (unsigned)text[i]);
    }
    printf("\n");
}